

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QRegion __thiscall
QGraphicsViewPrivate::rubberBandRegion(QGraphicsViewPrivate *this,QWidget *widget,QRect *rect)

{
  long lVar1;
  int iVar2;
  QStyle *pQVar3;
  QRect *in_RCX;
  long in_FS_OFFSET;
  QRect local_a8;
  QStyleHintReturnMask local_98;
  QStyleOptionRubberBand option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.super_QStyleHintReturn = (QStyleHintReturn)&DAT_aaaaaaaaaaaaaaaa;
  local_98.region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  QStyleHintReturnMask::QStyleHintReturnMask(&local_98);
  option._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionRubberBand::QStyleOptionRubberBand(&option);
  QStyleOption::initFrom(&option.super_QStyleOption,(QWidget *)rect);
  option.super_QStyleOption.rect.x1.m_i = (in_RCX->x1).m_i;
  option.super_QStyleOption.rect.y1.m_i = (in_RCX->y1).m_i;
  option.super_QStyleOption.rect.x2.m_i = (in_RCX->x2).m_i;
  option.super_QStyleOption.rect.y2.m_i = (in_RCX->y2).m_i;
  option._68_4_ = option._68_4_ & 0xffffff00;
  option.shape = Rectangle;
  *(undefined1 **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
       = &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  local_a8 = QRect::adjusted(in_RCX,-1,-1,1,1);
  QRegion::operator+=((QRegion *)this,&local_a8);
  pQVar3 = QWidget::style((QWidget *)rect);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x36,&option,rect,&local_98);
  if (iVar2 != 0) {
    QRegion::operator&=((QRegion *)this,&local_98.region);
  }
  QStyleOption::~QStyleOption(&option.super_QStyleOption);
  QStyleHintReturnMask::~QStyleHintReturnMask(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QRegion)(QRegionData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QGraphicsViewPrivate::rubberBandRegion(const QWidget *widget, const QRect &rect) const
{
    QStyleHintReturnMask mask;
    QStyleOptionRubberBand option;
    option.initFrom(widget);
    option.rect = rect;
    option.opaque = false;
    option.shape = QRubberBand::Rectangle;

    QRegion tmp;
    tmp += rect.adjusted(-1, -1, 1, 1);
    if (widget->style()->styleHint(QStyle::SH_RubberBand_Mask, &option, widget, &mask))
        tmp &= mask.region;
    return tmp;
}